

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_TestLocation(FParser *this)

{
  bool bVar1;
  AActor *mobj;
  
  if (this->t_argc == 0) {
    mobj = GC::ReadBarrier<AActor>((AActor **)&this->Script->trigger);
  }
  else {
    mobj = actorvalue(this->t_argv);
  }
  if (mobj != (AActor *)0x0) {
    (this->t_return).type = 1;
    bVar1 = P_TestMobjLocation(mobj);
    *(uint *)&(this->t_return).value = (uint)bVar1;
  }
  return;
}

Assistant:

void FParser::SF_TestLocation()
{
	// use trigger object if not specified
	AActor *mo;
	if(t_argc)
	{
		mo = actorvalue(t_argv[0]);
	}
	else
	{
		mo = Script->trigger;
	}

	if (mo)
	{
		t_return.type = svt_int;
		t_return.value.f = !!P_TestMobjLocation(mo);
	}
}